

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O2

void ScriptToUniv(CScript *script,UniValue *out,bool include_hex,bool include_address,
                 SigningProvider *provider)

{
  uint uVar1;
  uint uVar2;
  CScript *pCVar3;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  bool bVar4;
  TxoutType t;
  pointer *__ptr;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solns;
  CTxDestination address;
  undefined8 in_stack_fffffffffffffcd8;
  undefined8 uVar5;
  undefined8 in_stack_fffffffffffffce0;
  undefined8 uVar6;
  undefined8 in_stack_fffffffffffffce8;
  undefined8 uVar7;
  undefined8 in_stack_fffffffffffffcf0;
  UniValue in_stack_fffffffffffffcf8;
  string local_2a8 [32];
  UniValue local_288;
  string local_230 [32];
  UniValue local_210;
  string local_1b8 [32];
  UniValue local_198;
  string local_140 [32];
  string local_120;
  UniValue local_100;
  string local_a8 [32];
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_88;
  undefined1 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._16_8_ = 0;
  local_88._24_8_ = 0;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_40 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"asm",(allocator<char> *)&stack0xfffffffffffffcd8);
  ScriptToAsmStr_abi_cxx11_(&local_120,script,false);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_100,&local_120);
  key._M_string_length = in_stack_fffffffffffffce0;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcd8;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffffce8;
  key.field_2._8_8_ = in_stack_fffffffffffffcf0;
  UniValue::pushKV(out,key,in_stack_fffffffffffffcf8);
  UniValue::~UniValue(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_a8);
  if (include_address) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_140,"desc",(allocator<char> *)&stack0xfffffffffffffcff);
    InferDescriptor((CScript *)&stack0xfffffffffffffcd8,(SigningProvider *)script);
    (**(code **)(*(long *)in_stack_fffffffffffffcd8 + 0x20))(&local_120,in_stack_fffffffffffffcd8,0)
    ;
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_198,&local_120);
    key_00._M_string_length = in_stack_fffffffffffffce0;
    key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcd8;
    key_00.field_2._M_allocated_capacity = in_stack_fffffffffffffce8;
    key_00.field_2._8_8_ = in_stack_fffffffffffffcf0;
    UniValue::pushKV(out,key_00,in_stack_fffffffffffffcf8);
    UniValue::~UniValue(&local_198);
    std::__cxx11::string::~string((string *)&local_120);
    if ((long *)in_stack_fffffffffffffcd8 != (long *)0x0) {
      (**(code **)(*(long *)in_stack_fffffffffffffcd8 + 8))();
    }
    std::__cxx11::string::~string(local_140);
  }
  if (include_hex) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_1b8,"hex",(allocator<char> *)&stack0xfffffffffffffcd8);
    uVar1 = (script->super_CScriptBase)._size;
    uVar2 = uVar1 - 0x1d;
    pCVar3 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar1 < 0x1d) {
      uVar2 = uVar1;
      pCVar3 = script;
    }
    s.m_size._0_4_ = uVar2;
    s.m_data = (uchar *)pCVar3;
    s.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(&local_120,s);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_210,&local_120);
    key_01._M_string_length = in_stack_fffffffffffffce0;
    key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcd8;
    key_01.field_2._M_allocated_capacity = in_stack_fffffffffffffce8;
    key_01.field_2._8_8_ = in_stack_fffffffffffffcf0;
    UniValue::pushKV(out,key_01,in_stack_fffffffffffffcf8);
    UniValue::~UniValue(&local_210);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string(local_1b8);
  }
  uVar5 = (char *)0x0;
  uVar6 = 0;
  uVar7 = 0;
  t = Solver(script,(vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&stack0xfffffffffffffcd8);
  if ((include_address) &&
     (bVar4 = ExtractDestination(script,(CTxDestination *)&local_88._M_first), bVar4 && t != PUBKEY)
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_230,"address",(allocator<char> *)&stack0xfffffffffffffcff);
    EncodeDestination_abi_cxx11_(&local_120,(CTxDestination *)&local_88._M_first);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_288,&local_120);
    key_02._M_string_length = uVar6;
    key_02._M_dataplus._M_p = (pointer)uVar5;
    key_02.field_2._M_allocated_capacity = uVar7;
    key_02.field_2._8_8_ = in_stack_fffffffffffffcf0;
    UniValue::pushKV(out,key_02,in_stack_fffffffffffffcf8);
    UniValue::~UniValue(&local_288);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string(local_230);
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,"type",(allocator<char> *)&stack0xfffffffffffffcff);
  GetTxnOutputType_abi_cxx11_(&local_120,t);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)&stack0xfffffffffffffd00,&local_120);
  key_03._M_string_length = uVar6;
  key_03._M_dataplus._M_p = (pointer)uVar5;
  key_03.field_2._M_allocated_capacity = uVar7;
  key_03.field_2._8_8_ = in_stack_fffffffffffffcf0;
  UniValue::pushKV(out,key_03,in_stack_fffffffffffffcf8);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffd00);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string(local_2a8);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&stack0xfffffffffffffcd8);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_88._M_first);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ScriptToUniv(const CScript& script, UniValue& out, bool include_hex, bool include_address, const SigningProvider* provider)
{
    CTxDestination address;

    out.pushKV("asm", ScriptToAsmStr(script));
    if (include_address) {
        out.pushKV("desc", InferDescriptor(script, provider ? *provider : DUMMY_SIGNING_PROVIDER)->ToString());
    }
    if (include_hex) {
        out.pushKV("hex", HexStr(script));
    }

    std::vector<std::vector<unsigned char>> solns;
    const TxoutType type{Solver(script, solns)};

    if (include_address && ExtractDestination(script, address) && type != TxoutType::PUBKEY) {
        out.pushKV("address", EncodeDestination(address));
    }
    out.pushKV("type", GetTxnOutputType(type));
}